

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

float ** Emb_ManMatrAlloc(int nDims)

{
  float **ppfVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = (long)nDims;
  ppfVar1 = (float **)malloc((lVar3 * 4 + 8) * lVar3);
  *ppfVar1 = (float *)(ppfVar1 + lVar3);
  for (lVar2 = 1; lVar2 < lVar3; lVar2 = lVar2 + 1) {
    ppfVar1[lVar2] = ppfVar1[lVar2 + -1] + lVar3;
  }
  return ppfVar1;
}

Assistant:

float ** Emb_ManMatrAlloc( int nDims )
{
    int i;
    float ** pMatr = (float **)ABC_ALLOC( char, sizeof(float *) * nDims + sizeof(float) * nDims * nDims );
    pMatr[0] = (float *)(pMatr + nDims);
    for ( i = 1; i < nDims; i++ )
        pMatr[i] = pMatr[i-1] + nDims;
    return pMatr;
}